

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Expression::visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
          (Expression *this,Expression *expr,ExpressionPrinter *visitor)

{
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(expr->kind) {
  case Invalid:
  case RealLiteral:
  case TimeLiteral:
  case UnbasedUnsizedIntegerLiteral:
  case NullLiteral:
  case UnboundedLiteral:
  case HierarchicalValue:
  case MemberAccess:
  case DataType:
  case TypeReference:
  case HierarchicalReference:
  case EmptyArgument:
    return;
  case IntegerLiteral:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(IntegerLiteral *)expr);
    return;
  case StringLiteral:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(StringLiteral *)expr);
    return;
  case NamedValue:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(NamedValueExpression *)expr);
    return;
  case UnaryOp:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(UnaryExpression *)expr);
    return;
  case BinaryOp:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(BinaryExpression *)expr);
    return;
  case ConditionalOp:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(ConditionalExpression *)expr);
    return;
  case Inside:
    InsideExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>((InsideExpression *)expr,visitor);
    return;
  case Assignment:
    AssignmentExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((AssignmentExpression *)expr,visitor);
    return;
  case Concatenation:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(ConcatenationExpression *)expr);
    return;
  case Replication:
    ReplicationExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((ReplicationExpression *)expr,visitor);
    return;
  case Streaming:
    StreamingConcatenationExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((StreamingConcatenationExpression *)expr,visitor);
    return;
  case ElementSelect:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(ElementSelectExpression *)expr);
    return;
  case RangeSelect:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(RangeSelectExpression *)expr);
    return;
  case Call:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(CallExpression *)expr);
    return;
  case Conversion:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(ConversionExpression *)expr);
    return;
  case LValueReference:
    hgdb::rtl::ExpressionPrinter::handle(visitor,(LValueReferenceExpression *)expr);
    return;
  case SimpleAssignmentPattern:
  case StructuredAssignmentPattern:
    AssignmentPatternExpressionBase::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((AssignmentPatternExpressionBase *)expr,visitor);
    return;
  case ReplicatedAssignmentPattern:
    ReplicatedAssignmentPatternExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((ReplicatedAssignmentPatternExpression *)expr,visitor);
    return;
  case OpenRange:
    OpenRangeExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((OpenRangeExpression *)expr,visitor);
    return;
  case Dist:
    DistExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>((DistExpression *)expr,visitor);
    return;
  case NewArray:
    NewArrayExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((NewArrayExpression *)expr,visitor);
    return;
  case NewClass:
    NewClassExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((NewClassExpression *)expr,visitor);
    return;
  case NewCovergroup:
    NewCovergroupExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((NewCovergroupExpression *)expr,visitor);
    return;
  case CopyClass:
    CopyClassExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((CopyClassExpression *)expr,visitor);
    return;
  case MinTypMax:
    MinTypMaxExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((MinTypMaxExpression *)expr,visitor);
    return;
  case ClockingEvent:
    ClockingEventExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((ClockingEventExpression *)expr,visitor);
    return;
  case AssertionInstance:
    AssertionInstanceExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((AssertionInstanceExpression *)expr,visitor);
    return;
  case TaggedUnion:
    TaggedUnionExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
              ((TaggedUnionExpression *)expr,visitor);
    return;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x15b);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}